

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.c
# Opt level: O1

void pack_names(void)

{
  bucket **ppbVar1;
  char cVar2;
  char *pcVar3;
  int iVar4;
  size_t sVar5;
  bucket *pbVar6;
  char *pcVar7;
  long lVar8;
  
  name_pool_size = 0xd;
  pbVar6 = first_symbol;
  if (first_symbol != (bucket *)0x0) {
    do {
      iVar4 = name_pool_size;
      sVar5 = strlen(pbVar6->name);
      name_pool_size = iVar4 + (int)sVar5 + 1;
      ppbVar1 = &pbVar6->next;
      pbVar6 = *ppbVar1;
    } while (*ppbVar1 != (bucket *)0x0);
  }
  name_pool = (char *)malloc((ulong)(uint)name_pool_size);
  if (name_pool == (char *)0x0) {
    no_space();
  }
  pcVar7 = name_pool;
  builtin_strncpy(name_pool,"$accept",8);
  builtin_strncpy(pcVar7 + 8,"$end",5);
  if (first_symbol != (bucket *)0x0) {
    pcVar7 = pcVar7 + 0xd;
    pbVar6 = first_symbol;
    do {
      pcVar3 = pbVar6->name;
      lVar8 = 0;
      do {
        cVar2 = pcVar3[lVar8];
        pcVar7[lVar8] = cVar2;
        lVar8 = lVar8 + 1;
      } while (cVar2 != '\0');
      free(pbVar6->name);
      pbVar6->name = pcVar7;
      pbVar6 = pbVar6->next;
      pcVar7 = pcVar7 + lVar8;
    } while (pbVar6 != (bucket *)0x0);
  }
  return;
}

Assistant:

void pack_names()
{
    register bucket *bp;
    register char *p, *s, *t;

    name_pool_size = 13;  /* 13 == sizeof("$end") + sizeof("$accept") */
    for (bp = first_symbol; bp; bp = bp->next)
	name_pool_size += strlen(bp->name) + 1;
    name_pool = MALLOC(name_pool_size);
    if (name_pool == 0) no_space();

    strcpy(name_pool, "$accept");
    strcpy(name_pool+8, "$end");
    t = name_pool + 13;
    for (bp = first_symbol; bp; bp = bp->next) {
	p = t;
	s = bp->name;
	while ((*t++ = *s++)) continue;
	FREE(bp->name);
	bp->name = p; }
}